

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::ErrorTest_ErrorComparison_DefaultErrorsEqualToEachOther_Test::TestBody
          (ErrorTest_ErrorComparison_DefaultErrorsEqualToEachOther_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *message;
  Error rhs;
  Error lhs;
  AssertHelper AStack_88;
  Message local_80;
  internal local_78 [8];
  undefined8 *local_70;
  Error local_68;
  Error local_40;
  
  paVar1 = &local_40.mMessage.field_2;
  local_40.mCode = kNone;
  local_40.mMessage._M_string_length = 0;
  local_40.mMessage.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_68.mMessage.field_2;
  local_68.mCode = kNone;
  local_68.mMessage._M_string_length = 0;
  local_68.mMessage.field_2._M_local_buf[0] = '\0';
  local_68.mMessage._M_dataplus._M_p = (pointer)paVar2;
  local_40.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            (local_78,"lhs","rhs",&local_40,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message(&local_80);
    if (local_70 == (undefined8 *)0x0) {
      message = anon_var_dwarf_4278be + 9;
    }
    else {
      message = (char *)*local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&AStack_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if (local_80.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_80.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_70 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_70 != local_70 + 2) {
      operator_delete((undefined8 *)*local_70);
    }
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.mMessage._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.mMessage._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(ErrorTest, ErrorComparison_DefaultErrorsEqualToEachOther)
{
    Error lhs;
    Error rhs;

    EXPECT_EQ(lhs, rhs);
}